

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_mull(TCGContext_conflict1 *tcg_ctx,TCGv_i64 dest,TCGv_i32 a,TCGv_i32 b,int size,int u)

{
  TCGv_i64 pTVar1;
  TCGv_i64 tmp;
  int u_local;
  int size_local;
  TCGv_i32 b_local;
  TCGv_i32 a_local;
  TCGv_i64 dest_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  switch(size * 2 | u) {
  case 0:
    gen_helper_neon_mull_s8(tcg_ctx,dest,a,b);
    break;
  case 1:
    gen_helper_neon_mull_u8(tcg_ctx,dest,a,b);
    break;
  case 2:
    gen_helper_neon_mull_s16(tcg_ctx,dest,a,b);
    break;
  case 3:
    gen_helper_neon_mull_u16(tcg_ctx,dest,a,b);
    break;
  case 4:
    pTVar1 = gen_muls_i64_i32(tcg_ctx,a,b);
    tcg_gen_mov_i64_aarch64(tcg_ctx,dest,pTVar1);
    tcg_temp_free_i64(tcg_ctx,pTVar1);
    break;
  case 5:
    pTVar1 = gen_mulu_i64_i32(tcg_ctx,a,b);
    tcg_gen_mov_i64_aarch64(tcg_ctx,dest,pTVar1);
    tcg_temp_free_i64(tcg_ctx,pTVar1);
    break;
  default:
    abort();
  }
  if (size < 2) {
    tcg_temp_free_i32(tcg_ctx,a);
    tcg_temp_free_i32(tcg_ctx,b);
  }
  return;
}

Assistant:

static inline void gen_neon_mull(TCGContext *tcg_ctx, TCGv_i64 dest, TCGv_i32 a, TCGv_i32 b,
                                 int size, int u)
{
    TCGv_i64 tmp;

    switch ((size << 1) | u) {
    case 0: gen_helper_neon_mull_s8(tcg_ctx, dest, a, b); break;
    case 1: gen_helper_neon_mull_u8(tcg_ctx, dest, a, b); break;
    case 2: gen_helper_neon_mull_s16(tcg_ctx, dest, a, b); break;
    case 3: gen_helper_neon_mull_u16(tcg_ctx, dest, a, b); break;
    case 4:
        tmp = gen_muls_i64_i32(tcg_ctx, a, b);
        tcg_gen_mov_i64(tcg_ctx, dest, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
        break;
    case 5:
        tmp = gen_mulu_i64_i32(tcg_ctx, a, b);
        tcg_gen_mov_i64(tcg_ctx, dest, tmp);
        tcg_temp_free_i64(tcg_ctx, tmp);
        break;
    default: abort();
    }

    /* gen_helper_neon_mull_[su]{8|16} do not free their parameters.
       Don't forget to clean them now.  */
    if (size < 2) {
        tcg_temp_free_i32(tcg_ctx, a);
        tcg_temp_free_i32(tcg_ctx, b);
    }
}